

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Apply * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::Apply,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,AST **args_2,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_3,vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  *args_4,bool *args_5,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_6,vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *args_7,bool *args_8)

{
  Apply *pAVar1;
  Fodder *in_RCX;
  LocationRange *in_RDX;
  uint uVar2;
  Fodder *unaff_RBP;
  Apply *in_RSI;
  AST *in_R8;
  Fodder *in_R9;
  Fodder *unaff_retaddr;
  value_type *in_stack_00000018;
  byte *in_stack_00000020;
  Apply *r;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  ArgParams *in_stack_ffffffffffffffb8;
  
  pAVar1 = (Apply *)operator_new(0xf8);
  uVar2 = *in_stack_00000020 & 1;
  Apply::Apply(in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffb8,
               (bool)in_stack_ffffffffffffffb7,unaff_RBP,unaff_retaddr,
               (bool)in_stack_ffffffffffffffb6);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)
             CONCAT44(in_stack_ffffffffffffff84,uVar2),in_stack_00000018);
  return pAVar1;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }